

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O0

optional<unsigned_int> __thiscall
slang::ast::CallExpression::getEffectiveWidthImpl(CallExpression *this)

{
  bool bVar1;
  bitwidth_t bVar2;
  SystemSubroutine *pSVar3;
  undefined4 extraout_var;
  uint *in_RDI;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *callInfo;
  optional<unsigned_int> result;
  undefined4 in_stack_ffffffffffffffe0;
  Type *in_stack_ffffffffffffffe8;
  _Optional_payload_base<unsigned_int> local_8;
  
  bVar1 = isSystemCall((CallExpression *)0xeff867);
  if (bVar1) {
    in_stack_ffffffffffffffe8 =
         (Type *)std::
                 get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                           ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             *)0xeff87a);
    pSVar3 = not_null<const_slang::ast::SystemSubroutine_*>::operator->
                       ((not_null<const_slang::ast::SystemSubroutine_*> *)0xeff889);
    local_8._M_payload._M_value = (*pSVar3->_vptr_SystemSubroutine[6])();
    local_8._4_4_ = extraout_var;
    bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0xeff8a1);
    if (bVar1) {
      return (optional<unsigned_int>)local_8;
    }
  }
  not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xeff8b8);
  bVar2 = Type::getBitWidth(in_stack_ffffffffffffffe8);
  std::optional<unsigned_int>::optional<unsigned_int,_true>
            ((optional<unsigned_int> *)CONCAT44(bVar2,in_stack_ffffffffffffffe0),in_RDI);
  return (optional<unsigned_int>)local_8;
}

Assistant:

std::optional<bitwidth_t> CallExpression::getEffectiveWidthImpl() const {
    if (isSystemCall()) {
        auto& callInfo = std::get<1>(subroutine);
        if (auto result = callInfo.subroutine->getEffectiveWidth())
            return result;
    }
    return type->getBitWidth();
}